

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::expand
          (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this)

{
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  *this_00;
  char *pcVar1;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar2;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  anon_class_16_2_f84bbffd f;
  
  sVar7 = 8;
  if (this->_capacity != 0) {
    sVar7 = this->_capacity * 2;
  }
  uVar5 = sVar7 * 0x1c + 0xf & 0xfffffffffffffff0;
  if (uVar5 == 0) {
    pMVar3 = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar5 < 0x11) {
    pMVar3 = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar5 < 0x19) {
    pMVar3 = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar5 < 0x21) {
    pMVar3 = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar5 < 0x31) {
    pMVar3 = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar5 < 0x41) {
    pMVar3 = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pMVar3 = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             ::operator_new(uVar5,0x10);
  }
  if (this->_capacity == 0) {
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    uVar4 = 0;
    do {
      this_00 = (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                 *)((pMVar3->term).super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._content + lVar6 + -1);
      pMVar2 = this->_stack;
      pcVar1 = (pMVar3->term).super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._content + lVar6 + -1;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1[8] = '\0';
      pcVar1[9] = '\0';
      pcVar1[10] = '\0';
      pcVar1[0xb] = '\0';
      pcVar1[0xc] = '\0';
      pcVar1[0xd] = '\0';
      pcVar1[0xe] = '\0';
      pcVar1[0xf] = '\0';
      pcVar1 = (pMVar3->term).super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._content + lVar6 + 0xf;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      (pMVar3->term).super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[lVar6 + -1] =
           (pMVar2->term).super_PolyNfSuper._inner.
           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
           .
           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           ._content[lVar6 + -1] & 3;
      f.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 *)((pMVar2->term).super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._content + lVar6 + -1);
      f.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                *)this_00;
      CoproductImpl::
      RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
      ::
      switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>&&)::_lambda(auto:1)_1_>
                (this_00,f);
      *(undefined4 *)((long)(&pMVar3->term + 1) + lVar6) =
           *(undefined4 *)((long)(&pMVar2->term + 1) + lVar6);
      uVar4 = uVar4 + 1;
      uVar5 = this->_capacity;
      lVar6 = lVar6 + 0x1c;
    } while (uVar4 < uVar5);
    pMVar2 = this->_stack;
    if (pMVar2 != (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
      uVar4 = uVar5 * 0x1c + 0xf & 0xfffffffffffffff0;
      if (uVar4 == 0) {
        *(undefined8 *)
         &(pMVar2->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pMVar2;
      }
      else if (uVar4 < 0x11) {
        *(undefined8 *)
         &(pMVar2->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pMVar2;
      }
      else if (uVar4 < 0x19) {
        *(undefined8 *)
         &(pMVar2->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pMVar2;
      }
      else if (uVar4 < 0x21) {
        *(undefined8 *)
         &(pMVar2->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pMVar2;
      }
      else if (uVar4 < 0x31) {
        *(undefined8 *)
         &(pMVar2->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pMVar2;
      }
      else if (uVar4 < 0x41) {
        *(undefined8 *)
         &(pMVar2->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pMVar2;
      }
      else {
        operator_delete(pMVar2,0x10);
        uVar5 = this->_capacity;
      }
    }
  }
  this->_stack = pMVar3;
  this->_cursor = pMVar3 + uVar5;
  this->_end = pMVar3 + sVar7;
  this->_capacity = sVar7;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }